

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>_>
::Container::Container
          (Container *this,int d,
          CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>
          *c)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 uVar2;
  size_type sVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  int iVar7;
  Context CVar8;
  _Alloc_hider local_60;
  size_type local_50;
  undefined8 uStack_48;
  
  local_60._M_p = (c->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p;
  paVar1 = &(c->super_FunctionalConstraint).super_BasicConstraint.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p == paVar1) {
    local_50 = paVar1->_M_allocated_capacity;
    uStack_48 = *(undefined8 *)
                 ((long)&(c->super_FunctionalConstraint).super_BasicConstraint.name_.field_2 + 8);
    local_60._M_p = (pointer)&local_50;
  }
  else {
    local_50 = paVar1->_M_allocated_capacity;
  }
  sVar3 = (c->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length;
  (c->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1;
  (c->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length = 0;
  (c->super_FunctionalConstraint).super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  iVar7 = (c->super_FunctionalConstraint).result_var_;
  CVar8.value_ = (c->super_FunctionalConstraint).ctx.value_;
  piVar4 = (c->
           super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
           ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5 = (c->
           super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
           ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar6 = (c->
           super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
           ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (c->
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
  ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (c->
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
  ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (c->
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
  ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  uVar2 = (c->
          super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
          ).field_0x18;
  paVar1 = &(this->con_).con_flat_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  (this->con_).con_flat_.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
       (pointer)paVar1;
  if ((size_type *)local_60._M_p == &local_50) {
    paVar1->_M_allocated_capacity = local_50;
    *(undefined8 *)
     ((long)&(this->con_).con_flat_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2 +
     8) = uStack_48;
  }
  else {
    (this->con_).con_flat_.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
         local_60._M_p;
    (this->con_).con_flat_.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
    _M_allocated_capacity = local_50;
  }
  (this->con_).con_flat_.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length =
       sVar3;
  (this->con_).con_flat_.super_FunctionalConstraint.result_var_ = iVar7;
  (this->con_).con_flat_.super_FunctionalConstraint.ctx = (Context)CVar8.value_;
  (this->con_).con_flat_.
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
  .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       piVar4;
  *(pointer *)
   ((long)&(this->con_).con_flat_.
           super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
           .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data + 8)
       = piVar5;
  *(pointer *)
   ((long)&(this->con_).con_flat_.
           super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
           .args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data +
   0x10) = piVar6;
  (this->con_).con_flat_.
  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
  .field_0x18 = uVar2;
  this->depth_ = d;
  (this->ctx_redef_).value_ = CTX_NONE;
  *(undefined4 *)((long)&(this->ctx_redef_).value_ + 3) = 0;
  return;
}

Assistant:

Container(int d, Constraint&& c) noexcept
      : con_(std::move(c)), depth_(d) { }